

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O0

void glob_audio_properties(t_pd *dummy,t_floatarg flongform)

{
  int iVar1;
  char *pcVar2;
  char local_8da8 [8];
  char blocksize [80];
  char callback [80];
  char srate [80];
  int local_8cac;
  int local_8ca8;
  int i;
  int cancallback;
  int canmulti;
  int noutdevs;
  int nindevs;
  char *outdevs [128];
  char *indevs [128];
  char device [1000];
  char local_80a8 [8];
  char outdevlist [16384];
  char indevlist [16384];
  undefined1 local_a0 [8];
  t_audiosettings as;
  t_floatarg flongform_local;
  t_pd *dummy_local;
  
  canmulti = 0;
  cancallback = 0;
  i = 0;
  local_8ca8 = 0;
  as.a_callback = (int)flongform;
  unique0x1000035a = dummy;
  sys_get_audio_devs(outdevlist + 0x3ff8,&canmulti,local_80a8,&cancallback,&i,&local_8ca8,0x80,0x80,
                     audio_nextsettings.a_api);
  for (local_8cac = 0; local_8cac < canmulti; local_8cac = local_8cac + 1) {
    outdevs[(long)local_8cac + 0x7f] = outdevlist + (long)(local_8cac << 7) + 0x3ff8;
  }
  for (local_8cac = 0; local_8cac < cancallback; local_8cac = local_8cac + 1) {
    *(char **)(&noutdevs + (long)local_8cac * 2) = local_80a8 + (local_8cac << 7);
  }
  if (canmulti == 0) {
    canmulti = 1;
    outdevs[0x7f] = "";
  }
  if (cancallback == 0) {
    cancallback = 1;
    _noutdevs = "";
  }
  pdgui_vmess("set","rS","::audio_indevlist",(ulong)(uint)canmulti,outdevs + 0x7f);
  pdgui_vmess("set","rS","::audio_outdevlist",(ulong)(uint)cancallback,&noutdevs);
  sys_get_audio_settings((t_audiosettings *)local_a0);
  if ((1 < (int)local_a0._4_4_) || (1 < as.a_chindevvec[2])) {
    as.a_callback = 0x3f800000;
  }
  iVar1 = audio_isfixedsr(local_a0._0_4_);
  pcVar2 = "";
  if (iVar1 != 0) {
    pcVar2 = "!";
  }
  sprintf(callback + 0x48,"%s%d",pcVar2,(ulong)(uint)as.a_choutdevvec[2]);
  pcVar2 = "!";
  if (local_8ca8 != 0) {
    pcVar2 = "";
  }
  sprintf(blocksize + 0x48,"%s%d",pcVar2,(ulong)(uint)as.a_srate);
  iVar1 = audio_isfixedblocksize(local_a0._0_4_);
  pcVar2 = "";
  if (iVar1 != 0) {
    pcVar2 = "!";
  }
  sprintf(local_8da8,"%s%d",pcVar2,(ulong)(uint)as.a_advance);
  pdgui_stub_deleteforkey((void *)0x0);
  pdgui_stub_vnew(&glob_pdobject,"pdtk_audio_dialog",glob_audio_properties,
                  "iiii iiii iiii iiii  s ii s i s",(ulong)(uint)as.a_api,(ulong)(uint)as.a_nindev,
                  as.a_indevvec[0],as.a_indevvec[1],as.a_indevvec[3],as.a_nchindev,
                  as.a_chindevvec[0],as.a_chindevvec[1],as.a_chindevvec[3],as.a_noutdev,
                  as.a_outdevvec[0],as.a_outdevvec[1],as.a_outdevvec[3],as.a_nchoutdev,
                  as.a_choutdevvec[0],as.a_choutdevvec[1],callback + 0x48,as.a_choutdevvec[3],i,
                  blocksize + 0x48,(uint)((float)as.a_callback != 0.0),local_8da8);
  return;
}

Assistant:

void glob_audio_properties(t_pd *dummy, t_floatarg flongform)
{
    t_audiosettings as;
        /* these are all the devices on your system: */
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    char device[MAXPDSTRING];
    char *indevs[MAXNDEV], *outdevs[MAXNDEV];
    int nindevs = 0, noutdevs = 0, canmulti = 0, cancallback = 0, i;
    char srate[80], callback[80], blocksize[80];

    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs, &canmulti,
         &cancallback, MAXNDEV, DEVDESCSIZE, audio_nextsettings.a_api);

    for (i = 0; i < nindevs; i++)
        indevs[i] = indevlist + i * DEVDESCSIZE;
    for (i = 0; i < noutdevs; i++)
        outdevs[i] = outdevlist + i * DEVDESCSIZE;

    if(!nindevs) {
        nindevs = 1;
        indevs[0] = "";
    }
    if(!noutdevs) {
        noutdevs = 1;
        outdevs[0] = "";
    }

    pdgui_vmess("set", "rS",
            "::audio_indevlist",
            nindevs, indevs);
    pdgui_vmess("set", "rS",
            "::audio_outdevlist",
            noutdevs, outdevs);

    sys_get_audio_settings(&as);

    if (as.a_nindev > 1 || as.a_noutdev > 1)
        flongform = 1;

    sprintf(srate, "%s%d", audio_isfixedsr(as.a_api)?"!":"", as.a_srate);
    sprintf(callback, "%s%d", cancallback?"":"!", as.a_callback);
    sprintf(blocksize, "%s%d", audio_isfixedblocksize(as.a_api)?"!":"", as.a_blocksize);

        /* values that are fixed and must not be changed by the GUI are
        prefixed with '!';  * the GUI will then display these values but
        disable their widgets */
    pdgui_stub_deleteforkey(0);
    pdgui_stub_vnew(&glob_pdobject,
        "pdtk_audio_dialog", (void *)glob_audio_properties,
        "iiii iiii iiii iiii  s ii s i s",
        as.a_indevvec   [0], as.a_indevvec   [1], as.a_indevvec   [2], as.a_indevvec   [3],
        as.a_chindevvec [0], as.a_chindevvec [1], as.a_chindevvec [2], as.a_chindevvec [3],
        as.a_outdevvec  [0], as.a_outdevvec  [1], as.a_outdevvec  [2], as.a_outdevvec  [3],
        as.a_choutdevvec[0], as.a_choutdevvec[1], as.a_choutdevvec[2], as.a_choutdevvec[3],
        srate,
        as.a_advance, canmulti,
        callback,
        (flongform != 0),
        blocksize);
}